

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O1

QString * qEnvironmentVariable(QString *__return_storage_ptr__,char *varName)

{
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)0x0;
  local_28.d.ptr = (char16_t *)0x0;
  local_28.d.size = 0;
  qEnvironmentVariable(__return_storage_ptr__,varName,&local_28);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
        return __return_storage_ptr__;
      }
      goto LAB_0021a4d6;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
LAB_0021a4d6:
  __stack_chk_fail();
}

Assistant:

QString qEnvironmentVariable(const char *varName)
{
    return qEnvironmentVariable(varName, QString());
}